

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_struct_as_nested_root
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,char *fid,flatcc_json_printer_struct_f *pf)

{
  char *pcVar1;
  flatbuffers_uoffset_t fVar2;
  int iVar3;
  void *pvVar4;
  flatbuffers_uoffset_t bufsiz;
  flatbuffers_uoffset_t *buf;
  char *fid_local;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  pvVar4 = get_field_ptr(td,id);
  if (pvVar4 != (void *)0x0) {
    fVar2 = __flatbuffers_uoffset_read_from_pe(pvVar4);
    pvVar4 = (void *)((long)pvVar4 + (ulong)fVar2);
    fVar2 = __flatbuffers_uoffset_read_from_pe(pvVar4);
    iVar3 = accept_header(ctx,pvVar4,(ulong)fVar2,fid);
    if (iVar3 != 0) {
      iVar3 = td->count;
      td->count = iVar3 + 1;
      if (iVar3 != 0) {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = ',';
      }
      print_name(ctx,name,len);
      ctx->level = ctx->level + 1;
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '{';
      pvVar4 = read_uoffset_ptr(pvVar4);
      (*pf)(ctx,pvVar4);
      if (ctx->indent != '\0') {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = '\n';
        ctx->level = ctx->level + -1;
        print_indent(ctx);
      }
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '}';
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_as_nested_root(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        const char *fid,
        flatcc_json_printer_struct_f *pf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    if (0 == (buf = get_field_ptr(td, id))) {
        return;
    }
    buf = (const uoffset_t *)((size_t)buf + __flatbuffers_uoffset_read_from_pe(buf));
    bufsiz = __flatbuffers_uoffset_read_from_pe(buf);
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return;
    }
    if (td->count++) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('{');
    pf(ctx, read_uoffset_ptr(buf));
    print_end('}');
}